

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void read_long_string(LexState *ls,SemInfo *seminfo,int sep)

{
  size_t sVar1;
  ZIO *pZVar2;
  byte *pbVar3;
  uint uVar4;
  int iVar5;
  TString *pTVar6;
  char *msg;
  
  save(ls,ls->current);
  pZVar2 = ls->z;
  sVar1 = pZVar2->n;
  pZVar2->n = pZVar2->n - 1;
  if (sVar1 == 0) {
    uVar4 = luaZ_fill(pZVar2);
  }
  else {
    pbVar3 = (byte *)pZVar2->p;
    pZVar2->p = (char *)(pbVar3 + 1);
    uVar4 = (uint)*pbVar3;
  }
  ls->current = uVar4;
  if ((uVar4 == 0xd) || (uVar4 == 10)) {
    inclinenumber(ls);
  }
  do {
    while (iVar5 = ls->current, 0xc < iVar5) {
      if (iVar5 == 0xd) goto LAB_0010c3a3;
      if (iVar5 != 0x5d) goto LAB_0010c3d4;
      iVar5 = skip_sep(ls);
      if (iVar5 == sep) {
        save(ls,ls->current);
        pZVar2 = ls->z;
        sVar1 = pZVar2->n;
        pZVar2->n = pZVar2->n - 1;
        if (sVar1 == 0) {
          uVar4 = luaZ_fill(pZVar2);
        }
        else {
          pbVar3 = (byte *)pZVar2->p;
          pZVar2->p = (char *)(pbVar3 + 1);
          uVar4 = (uint)*pbVar3;
        }
        ls->current = uVar4;
        if (seminfo != (SemInfo *)0x0) {
          pTVar6 = luaX_newstring(ls,ls->buff->buffer + (ulong)(uint)sep + 2,
                                  ls->buff->n - (ulong)(sep * 2 + 4));
          seminfo->ts = pTVar6;
        }
        return;
      }
    }
    if (iVar5 == 10) {
LAB_0010c3a3:
      save(ls,10);
      inclinenumber(ls);
      if (seminfo == (SemInfo *)0x0) {
        ls->buff->n = 0;
      }
    }
    else {
      if (iVar5 == -1) {
        msg = "unfinished long string";
        if (seminfo == (SemInfo *)0x0) {
          msg = "unfinished long comment";
        }
        luaX_lexerror(ls,msg,0x11f);
      }
LAB_0010c3d4:
      if (seminfo != (SemInfo *)0x0) {
        save(ls,iVar5);
      }
      pZVar2 = ls->z;
      sVar1 = pZVar2->n;
      pZVar2->n = pZVar2->n - 1;
      if (sVar1 == 0) {
        uVar4 = luaZ_fill(pZVar2);
      }
      else {
        pbVar3 = (byte *)pZVar2->p;
        pZVar2->p = (char *)(pbVar3 + 1);
        uVar4 = (uint)*pbVar3;
      }
      ls->current = uVar4;
    }
  } while( true );
}

Assistant:

static void read_long_string(LexState*ls,SemInfo*seminfo,int sep){
int cont=0;
(void)(cont);
save_and_next(ls);
if(currIsNewline(ls))
inclinenumber(ls);
for(;;){
switch(ls->current){
case(-1):
luaX_lexerror(ls,(seminfo)?"unfinished long string":
"unfinished long comment",TK_EOS);
break;
case']':{
if(skip_sep(ls)==sep){
save_and_next(ls);
goto endloop;
}
break;
}
case'\n':
case'\r':{
save(ls,'\n');
inclinenumber(ls);
if(!seminfo)luaZ_resetbuffer(ls->buff);
break;
}
default:{
if(seminfo)save_and_next(ls);
else next(ls);
}
}
}endloop:
if(seminfo)
seminfo->ts=luaX_newstring(ls,luaZ_buffer(ls->buff)+(2+sep),
luaZ_bufflen(ls->buff)-2*(2+sep));
}